

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O1

void uss_return_handle_raw(UnixSftpServer *uss,SftpReplyBuilder *reply,int index,uint seq)

{
  ptrlen pVar1;
  uchar handlebuf [8];
  undefined4 local_18;
  undefined1 local_14;
  undefined3 local_13;
  
  _local_18 = CONCAT35(CONCAT21(CONCAT11((char)seq,(char)(seq >> 8)),(char)(seq >> 0x10)),
                       CONCAT14((char)(seq >> 0x18),
                                CONCAT31(CONCAT21((ushort)index << 8 | (ushort)index >> 8,
                                                  (char)((uint)index >> 0x10)),
                                         (char)((uint)index >> 0x18))));
  des_encrypt_xdmauth(uss->handlekey,&local_18,8);
  pVar1.len = 8;
  pVar1.ptr = &local_18;
  (*reply->vt->reply_handle)(reply,pVar1);
  return;
}

Assistant:

static void uss_return_handle_raw(
    UnixSftpServer *uss, SftpReplyBuilder *reply, int index, unsigned seq)
{
    unsigned char handlebuf[8];
    PUT_32BIT_MSB_FIRST(handlebuf, index);
    PUT_32BIT_MSB_FIRST(handlebuf + 4, seq);
    des_encrypt_xdmauth(uss->handlekey, handlebuf, 8);
    fxp_reply_handle(reply, make_ptrlen(handlebuf, 8));
}